

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

box3f * __thiscall
pbrt::Disk::getPrimBounds(box3f *__return_storage_ptr__,Disk *this,size_t param_1,affine3f *xfm)

{
  vec3f vVar1;
  affine3f _xfm;
  vec3f local_a0;
  vec3f local_94;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  uint uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  affine3f local_50;
  
  local_88._0_4_ = this->radius;
  local_88._4_4_ = this->height;
  uStack_80 = 0;
  local_78 = -(float)local_88;
  uStack_74 = (uint)local_88._4_4_ ^ 0x80000000;
  uStack_70 = 0x80000000;
  uStack_6c = 0x80000000;
  math::operator*(&local_50,xfm,&this->transform);
  (__return_storage_ptr__->lower).x = 3.4028235e+38;
  (__return_storage_ptr__->lower).y = 3.4028235e+38;
  *(undefined8 *)&(__return_storage_ptr__->lower).z = 0xff7fffff7f7fffff;
  (__return_storage_ptr__->upper).y = -3.4028235e+38;
  (__return_storage_ptr__->upper).z = -3.4028235e+38;
  local_94.x = local_78;
  local_94.z = 0.0;
  local_94.y = local_78;
  vVar1 = math::operator*(&local_50,&local_94);
  local_a0.z = vVar1.z;
  local_a0._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_a0);
  local_94.x = local_78;
  local_68 = local_88._4_4_;
  fStack_64 = local_88._4_4_;
  fStack_60 = local_88._4_4_;
  fStack_5c = local_88._4_4_;
  local_94.z = local_88._4_4_;
  local_94.y = local_78;
  vVar1 = math::operator*(&local_50,&local_94);
  local_a0.z = vVar1.z;
  local_a0._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_a0);
  local_94.x = local_78;
  local_94._4_8_ = local_88 & 0xffffffff;
  vVar1 = math::operator*(&local_50,&local_94);
  local_a0.z = vVar1.z;
  local_a0._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_a0);
  local_94.x = local_78;
  local_94.y = (float)local_88;
  local_94.z = local_88._4_4_;
  vVar1 = math::operator*(&local_50,&local_94);
  local_a0.z = vVar1.z;
  local_a0._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_a0);
  local_94.x = (float)local_88;
  local_94.z = 0.0;
  local_94.y = local_78;
  vVar1 = math::operator*(&local_50,&local_94);
  local_a0.z = vVar1.z;
  local_a0._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_a0);
  local_94.x = (float)local_88;
  local_94.z = local_68;
  local_94.y = local_78;
  vVar1 = math::operator*(&local_50,&local_94);
  local_a0.z = vVar1.z;
  local_a0._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_a0);
  local_94.x = (float)local_88;
  local_94._4_8_ = local_88 & 0xffffffff;
  vVar1 = math::operator*(&local_50,&local_94);
  local_a0.z = vVar1.z;
  local_a0._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_a0);
  local_94.x = (float)local_88;
  local_94._4_8_ = local_88;
  vVar1 = math::operator*(&local_50,&local_94);
  local_a0.z = vVar1.z;
  local_a0._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_a0);
  return __return_storage_ptr__;
}

Assistant:

box3f Disk::getPrimBounds(const size_t /*unused: primID*/, const affine3f &xfm) 
  {
    box3f ob(vec3f(-radius,-radius,0),vec3f(+radius,+radius,height));
    affine3f _xfm = xfm * transform;
      
    box3f bounds = box3f::empty_box();
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.upper.z)));
    return bounds;
  }